

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.c
# Opt level: O1

int av1_get_compressed_data(AV1_COMP *cpi,AV1_COMP_DATA *cpi_data)

{
  aom_internal_error_info *paVar1;
  MvCosts *pMVar2;
  RefCntBuffer *pRVar3;
  pthread_mutex_t *__mutex;
  int *piVar4;
  byte bVar5;
  int iVar6;
  uint uVar7;
  int *piVar8;
  uint uVar9;
  ulong uVar10;
  undefined1 auVar11 [16];
  
  iVar6 = _setjmp((__jmp_buf_tag *)((cpi->common).error)->jmp);
  paVar1 = (cpi->common).error;
  if (iVar6 != 0) {
    paVar1->setjmp = 0;
    return paVar1->error_code;
  }
  paVar1->setjmp = 1;
  if (cpi->ppi->use_svc != 0) {
    av1_one_pass_cbr_svc_start_layer(cpi);
  }
  cpi->is_dropped_frame = false;
  (cpi->common).showable_frame = 0;
  cpi_data->frame_size = 0;
  cpi->available_bs_size = cpi_data->cx_data_sz;
  pMVar2 = (cpi->td).mb.mv_costs;
  if (pMVar2 != (MvCosts *)0x0) {
    (cpi->common).features.allow_high_precision_mv = true;
    auVar11._8_4_ = (int)pMVar2;
    auVar11._0_8_ = pMVar2;
    auVar11._12_4_ = (int)((ulong)pMVar2 >> 0x20);
    pMVar2->nmv_cost_hp[0] = pMVar2->nmv_cost_hp_alloc[0] + 0x3fff;
    pMVar2->nmv_cost_hp[1] = (int *)(auVar11._8_8_ + 0x70000);
    pMVar2->nmv_cost[0] = pMVar2->nmv_cost_alloc[0] + 0x3fff;
    pMVar2->nmv_cost[1] = (int *)(auVar11._8_8_ + 0x30008);
    pMVar2->mv_cost_stack = pMVar2->nmv_cost_hp;
  }
  bVar5 = (cpi->oxcf).tool_cfg.frame_parallel_decoding_mode ^ 1;
  if ((cpi->oxcf).tile_cfg.enable_large_scale_tile != false) {
    bVar5 = 0;
  }
  (cpi->common).features.refresh_frame_context = bVar5;
  pRVar3 = (cpi->common).cur_frame;
  if (pRVar3 != (RefCntBuffer *)0x0) {
    pRVar3->ref_count = pRVar3->ref_count + -1;
    (cpi->common).cur_frame = (RefCntBuffer *)0x0;
  }
  __mutex = (pthread_mutex_t *)(cpi->common).buffer_pool;
  piVar4 = *(int **)((long)__mutex + 0x40);
  pthread_mutex_lock(__mutex);
  bVar5 = ((cpi->common).buffer_pool)->num_frame_bufs;
  uVar7 = 0;
  if (bVar5 != 0) {
    uVar10 = 0;
    piVar8 = piVar4;
    do {
      if (*piVar8 == 0) {
        uVar7 = (uint)uVar10;
        goto LAB_001c18b3;
      }
      uVar10 = uVar10 + 1;
      piVar8 = piVar8 + 0x1638;
    } while (bVar5 != uVar10);
    uVar7 = (uint)bVar5;
  }
LAB_001c18b3:
  uVar9 = 0xffffffff;
  if (uVar7 != bVar5) {
    piVar8 = piVar4 + (ulong)uVar7 * 0x1638;
    if (piVar4[(ulong)uVar7 * 0x1638 + 0x148] != 0) {
      *(undefined8 *)(piVar8 + 0x142) = *(undefined8 *)(piVar8 + 0x14a);
      *(undefined8 *)(piVar8 + 0x144) = *(undefined8 *)(piVar8 + 0x14c);
      *(undefined8 *)(piVar8 + 0x146) = *(undefined8 *)(piVar8 + 0x14e);
      piVar8[0x148] = 0;
    }
    *piVar8 = 1;
    uVar9 = uVar7;
  }
  pthread_mutex_unlock((pthread_mutex_t *)(cpi->common).buffer_pool);
  if (uVar9 != 0xffffffff) {
    pRVar3 = ((cpi->common).buffer_pool)->frame_bufs;
    (cpi->common).cur_frame = pRVar3 + (int)uVar9;
    aom_invalidate_pyramid(pRVar3[(int)uVar9].buf.y_pyramid);
    av1_invalidate_corner_list((((cpi->common).cur_frame)->buf).corners);
    pRVar3 = (cpi->common).cur_frame;
    pRVar3->interp_filter_selected[0] = 0;
    pRVar3->interp_filter_selected[1] = 0;
    pRVar3->interp_filter_selected[2] = 0;
    pRVar3->interp_filter_selected[3] = 0;
    if ((cpi->common).cur_frame != (RefCntBuffer *)0x0) goto LAB_001c1990;
  }
  aom_internal_error((cpi->common).error,AOM_CODEC_ERROR,"Failed to allocate new cur_frame");
LAB_001c1990:
  iVar6 = av1_encode_strategy(cpi,&cpi_data->frame_size,cpi_data->cx_data,cpi_data->cx_data_sz,
                              &cpi_data->lib_flags,&cpi_data->ts_frame_start,&cpi_data->ts_frame_end
                              ,cpi_data->timestamp_ratio,&cpi_data->pop_lookahead,cpi_data->flush);
  (cpi->rc).use_external_qp_one_pass = 0;
  if (iVar6 != 0) {
    if (iVar6 == -1) {
      ((cpi->common).error)->setjmp = 0;
      return -1;
    }
    aom_internal_error((cpi->common).error,AOM_CODEC_ERROR,"Failed to encode frame");
  }
  ((cpi->common).error)->setjmp = 0;
  return 0;
}

Assistant:

int av1_get_compressed_data(AV1_COMP *cpi, AV1_COMP_DATA *const cpi_data) {
  const AV1EncoderConfig *const oxcf = &cpi->oxcf;
  AV1_COMMON *const cm = &cpi->common;

  // The jmp_buf is valid only for the duration of the function that calls
  // setjmp(). Therefore, this function must reset the 'setjmp' field to 0
  // before it returns.
  if (setjmp(cm->error->jmp)) {
    cm->error->setjmp = 0;
    return cm->error->error_code;
  }
  cm->error->setjmp = 1;

#if CONFIG_INTERNAL_STATS
  cpi->frame_recode_hits = 0;
  cpi->time_compress_data = 0;
  cpi->bytes = 0;
#endif
#if CONFIG_ENTROPY_STATS
  if (cpi->compressor_stage == ENCODE_STAGE) {
    av1_zero(cpi->counts);
  }
#endif

#if CONFIG_BITSTREAM_DEBUG
  assert(cpi->oxcf.max_threads <= 1 &&
         "bitstream debug tool does not support multithreading");
  bitstream_queue_record_write();

  if (cm->seq_params->order_hint_info.enable_order_hint) {
    aom_bitstream_queue_set_frame_write(cm->current_frame.order_hint * 2 +
                                        cm->show_frame);
  } else {
    // This is currently used in RTC encoding. cm->show_frame is always 1.
    aom_bitstream_queue_set_frame_write(cm->current_frame.frame_number);
  }
#endif
  if (cpi->ppi->use_svc) {
    av1_one_pass_cbr_svc_start_layer(cpi);
  }

  cpi->is_dropped_frame = false;
  cm->showable_frame = 0;
  cpi_data->frame_size = 0;
  cpi->available_bs_size = cpi_data->cx_data_sz;
#if CONFIG_INTERNAL_STATS
  struct aom_usec_timer cmptimer;
  aom_usec_timer_start(&cmptimer);
#endif
  av1_set_high_precision_mv(cpi, 1, 0);

  // Normal defaults
  cm->features.refresh_frame_context =
      oxcf->tool_cfg.frame_parallel_decoding_mode
          ? REFRESH_FRAME_CONTEXT_DISABLED
          : REFRESH_FRAME_CONTEXT_BACKWARD;
  if (oxcf->tile_cfg.enable_large_scale_tile)
    cm->features.refresh_frame_context = REFRESH_FRAME_CONTEXT_DISABLED;

  if (assign_cur_frame_new_fb(cm) == NULL) {
    aom_internal_error(cpi->common.error, AOM_CODEC_ERROR,
                       "Failed to allocate new cur_frame");
  }

#if CONFIG_COLLECT_COMPONENT_TIMING
  // Accumulate 2nd pass time in 2-pass case or 1 pass time in 1-pass case.
  if (cpi->oxcf.pass == 2 || cpi->oxcf.pass == 0)
    start_timing(cpi, av1_encode_strategy_time);
#endif

  const int result = av1_encode_strategy(
      cpi, &cpi_data->frame_size, cpi_data->cx_data, cpi_data->cx_data_sz,
      &cpi_data->lib_flags, &cpi_data->ts_frame_start, &cpi_data->ts_frame_end,
      cpi_data->timestamp_ratio, &cpi_data->pop_lookahead, cpi_data->flush);

#if CONFIG_COLLECT_COMPONENT_TIMING
  if (cpi->oxcf.pass == 2 || cpi->oxcf.pass == 0)
    end_timing(cpi, av1_encode_strategy_time);

  // Print out timing information.
  // Note: Use "cpi->frame_component_time[0] > 100 us" to avoid showing of
  // show_existing_frame and lag-in-frames.
  if ((cpi->oxcf.pass == 2 || cpi->oxcf.pass == 0) &&
      cpi->frame_component_time[0] > 100) {
    int i;
    uint64_t frame_total = 0, total = 0;
    const GF_GROUP *const gf_group = &cpi->ppi->gf_group;
    FRAME_UPDATE_TYPE frame_update_type =
        get_frame_update_type(gf_group, cpi->gf_frame_index);

    fprintf(stderr,
            "\n Frame number: %d, Frame type: %s, Show Frame: %d, Frame Update "
            "Type: %d, Q: %d\n",
            cm->current_frame.frame_number,
            get_frame_type_enum(cm->current_frame.frame_type), cm->show_frame,
            frame_update_type, cm->quant_params.base_qindex);
    for (i = 0; i < kTimingComponents; i++) {
      cpi->component_time[i] += cpi->frame_component_time[i];
      // Use av1_encode_strategy_time (i = 0) as the total time.
      if (i == 0) {
        frame_total = cpi->frame_component_time[0];
        total = cpi->component_time[0];
      }
      fprintf(stderr,
              " %50s:  %15" PRId64 " us [%6.2f%%] (total: %15" PRId64
              " us [%6.2f%%])\n",
              get_component_name(i), cpi->frame_component_time[i],
              (float)((float)cpi->frame_component_time[i] * 100.0 /
                      (float)frame_total),
              cpi->component_time[i],
              (float)((float)cpi->component_time[i] * 100.0 / (float)total));
      cpi->frame_component_time[i] = 0;
    }
  }
#endif

  // Reset the flag to 0 afer encoding.
  cpi->rc.use_external_qp_one_pass = 0;

  if (result == -1) {
    cm->error->setjmp = 0;
    // Returning -1 indicates no frame encoded; more input is required
    return -1;
  }
  if (result != AOM_CODEC_OK) {
    aom_internal_error(cpi->common.error, AOM_CODEC_ERROR,
                       "Failed to encode frame");
  }
#if CONFIG_INTERNAL_STATS
  aom_usec_timer_mark(&cmptimer);
  cpi->time_compress_data += aom_usec_timer_elapsed(&cmptimer);
#endif  // CONFIG_INTERNAL_STATS

#if CONFIG_SPEED_STATS
  if (!is_stat_generation_stage(cpi) && !cm->show_existing_frame) {
    cpi->tx_search_count += cpi->td.mb.txfm_search_info.tx_search_count;
    cpi->td.mb.txfm_search_info.tx_search_count = 0;
  }
#endif  // CONFIG_SPEED_STATS

  cm->error->setjmp = 0;
  return AOM_CODEC_OK;
}